

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O0

void __thiscall Bitmap::duplicateLineDown(Bitmap *this,uint32_t y,uint32_t times)

{
  bool value_00;
  int iVar1;
  int iVar2;
  int32_t iVar3;
  uint local_4c;
  uint local_3c;
  uint32_t destinationPixel;
  uint32_t i_1;
  uint uStack_30;
  bool value;
  uint32_t sourcePixel;
  uint32_t x;
  uint32_t xend;
  uint32_t j;
  uint32_t line;
  uint32_t i;
  uint32_t origin;
  uint32_t times_local;
  uint32_t y_local;
  Bitmap *this_local;
  
  if (this->orientation == Horizontally) {
    iVar1 = y * this->widthByte;
    for (j = 1; (j <= times &&
                (iVar2 = j * this->widthByte + iVar1, iVar2 + this->widthByte <= this->lengthByte));
        j = j + 1) {
      for (x = 0; x < this->widthByte; x = x + 1) {
        this->data[iVar2 + x] = this->data[iVar1 + x];
      }
    }
  }
  else {
    if (this->orientation == Horizontally) {
      local_4c = this->width;
    }
    else {
      local_4c = this->height;
    }
    for (uStack_30 = 0; uStack_30 < local_4c; uStack_30 = uStack_30 + 1) {
      iVar3 = getPixelIndex(this,uStack_30,y);
      value_00 = getPixelValue(this,iVar3);
      for (local_3c = 1; local_3c <= times; local_3c = local_3c + 1) {
        iVar3 = getPixelIndex(this,uStack_30,y + local_3c);
        setPixelValue(this,iVar3,value_00);
      }
    }
  }
  return;
}

Assistant:

void Bitmap::duplicateLineDown(const uint32_t y, const uint32_t times)
{
#if 1
   if (orientation == Orientation::Horizontally)
   {
      //for horizontal orientation, this operation can be done very efficient just coping bytes
      uint32_t origin = y * this->widthByte;
      for (uint32_t i = 1; i <= times; ++i)
      {
         uint32_t line = i*this->widthByte + origin;
         if (line + this->widthByte <= this->lengthByte) //preven buffer overflow
         {
            for (uint32_t j = 0; j < this->widthByte; ++j)
            {
               this->data[line + j] = this->data[origin + j];
            }
            continue;
         }
         break;
      }
   }
   else //Vertically
#endif
   {
      //for vertical orientation, this must be done plain... (pixel by pixel)
      uint32_t xend = (orientation == Orientation::Horizontally) ? this->width : this->height; //but can also be done for horizontal orientation
      for (uint32_t x = 0; x < xend; ++x)
      {
         uint32_t sourcePixel = getPixelIndex(x, y);
         bool value = getPixelValue(sourcePixel);
         for (uint32_t i = 1; i <= times; ++i)
         {
            uint32_t destinationPixel = getPixelIndex(x, y+i);
            setPixelValue(destinationPixel, value);
         }
      }
   }
}